

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activate.hpp
# Opt level: O0

void __thiscall Sigmoid::Sigmoid(Sigmoid *this)

{
  Sigmoid *this_local;
  
  activate::activate(&this->super_activate);
  (this->super_activate)._vptr_activate = (_func_int **)&PTR_forward_00114d30;
  std::
  vector<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
  ::vector(&this->ret);
  return;
}

Assistant:

vector<vector<tensor *>> forward(vector<vector<tensor *>> x){
        int m=x.size(),n=x[0].size();
        ret=vector<vector<tensor *>> (m,vector<tensor *>(n,NULL));
        for(int i=0;i<m;i++){
            for(int j=0;j<n;j++){
                ret[i][j]= inverse({ad({Exp({Oppo({x[i][j]})})}, 1)});
            }
        }
        return ret;
    }